

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitMethodFld(bool isRoot,bool isScoped,RegSlot location,RegSlot callObjLocation,
                  PropertyId propertyId,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  bool registerCacheIdForCall)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ByteCodeWriter *pBVar5;
  uint cacheId_1;
  uint cacheId;
  OpCode opcode;
  bool registerCacheIdForCall_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyId propertyId_local;
  RegSlot callObjLocation_local;
  RegSlot location_local;
  bool isScoped_local;
  bool isRoot_local;
  
  if (isRoot) {
    if (isScoped) {
      cacheId_1._0_2_ = ScopedLdMethodFld;
    }
    else {
      cacheId_1._0_2_ = LdRootMethodFld;
    }
  }
  else if (callObjLocation == funcInfo->frameObjRegister) {
    cacheId_1._0_2_ = LdLocalMethodFld;
  }
  else {
    cacheId_1._0_2_ = LdMethodFld;
  }
  if ((isScoped) || (!isRoot)) {
    if ((!isScoped) && ((isRoot && (callObjLocation != 0xfffffffd)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1eca,
                         "(isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister)"
                         ,
                         "isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,callObjLocation,propertyId,true,false);
    if (callObjLocation == funcInfo->frameObjRegister) {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::ElementP
                (pBVar5,(OpCode)cacheId_1,location,uVar3,false,registerCacheIdForCall);
    }
    else {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::PatchableProperty
                (pBVar5,(OpCode)cacheId_1,location,callObjLocation,uVar3,false,
                 registerCacheIdForCall);
    }
  }
  else {
    uVar3 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,propertyId,true,false);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::PatchableRootProperty
              (pBVar5,(OpCode)cacheId_1,location,uVar3,true,false,registerCacheIdForCall);
  }
  return;
}

Assistant:

void EmitMethodFld(bool isRoot, bool isScoped, Js::RegSlot location, Js::RegSlot callObjLocation, Js::PropertyId propertyId, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool registerCacheIdForCall = true)
{
    Js::OpCode opcode;
    if (!isRoot)
    {
        if (callObjLocation == funcInfo->frameObjRegister)
        {
            opcode = Js::OpCode::LdLocalMethodFld;
        }
        else
        {
            opcode = Js::OpCode::LdMethodFld;
        }
    }
    else if (isScoped)
    {
        opcode = Js::OpCode::ScopedLdMethodFld;
    }
    else
    {
        opcode = Js::OpCode::LdRootMethodFld;
    }

    if (isScoped || !isRoot)
    {
        Assert(isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(callObjLocation, propertyId, true, false);
        if (callObjLocation == funcInfo->frameObjRegister)
        {
            byteCodeGenerator->Writer()->ElementP(opcode, location, cacheId, false /*isCtor*/, registerCacheIdForCall);
        }
        else
        {
            byteCodeGenerator->Writer()->PatchableProperty(opcode, location, callObjLocation, cacheId, false /*isCtor*/, registerCacheIdForCall);
        }
    }
    else
    {
        uint cacheId = funcInfo->FindOrAddRootObjectInlineCacheId(propertyId, true, false);
        byteCodeGenerator->Writer()->PatchableRootProperty(opcode, location, cacheId, true, false, registerCacheIdForCall);
    }
}